

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# report.c
# Opt level: O1

void pcut_report_test_done_unparsed
               (pcut_item_t *test,int outcome,char *unparsed_output,size_t unparsed_output_size)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *s;
  ulong __n;
  ulong uVar4;
  char *local_58;
  char *local_50;
  ulong local_48;
  ulong local_40;
  
  local_40 = 0x1000;
  local_50 = buffer_for_extra_output;
  memset(buffer_for_extra_output,0,0x1000);
  local_58 = buffer_for_error_messages;
  memset(buffer_for_error_messages,0,0x1000);
  if (unparsed_output[unparsed_output_size - 1] == '\0') {
    local_48 = 0x1000;
    do {
      s = unparsed_output + unparsed_output_size;
      uVar4 = 0;
      do {
        if (unparsed_output[uVar4] != '\0') {
          s = unparsed_output + uVar4;
          iVar2 = pcut_str_size(s);
          __n = (ulong)iVar2;
          sVar3 = unparsed_output_size - uVar4;
          if (uVar4 < 2) {
            if (local_40 < __n) goto LAB_00101ba7;
            memcpy(local_50,s,__n);
            local_50 = local_50 + __n;
            local_40 = local_40 - __n;
          }
          else {
            if (local_48 < __n) goto LAB_00101ba7;
            memcpy(local_58,s,__n);
            local_58 = local_58 + __n;
            local_48 = local_48 - __n;
          }
          s = unparsed_output + uVar4 + __n + 1;
          sVar3 = ~uVar4 + (unparsed_output_size - __n);
          bVar1 = true;
          goto LAB_00101bdd;
        }
        uVar4 = uVar4 + 1;
      } while (unparsed_output_size != uVar4);
      sVar3 = 0;
LAB_00101ba7:
      bVar1 = false;
LAB_00101bdd:
      unparsed_output = s;
      unparsed_output_size = sVar3;
    } while (bVar1);
  }
  if ((report_ops != (pcut_report_ops_t *)0x0) &&
     (report_ops->test_done != (_func_void_pcut_item_t_ptr_int_char_ptr_char_ptr_char_ptr *)0x0)) {
    (*report_ops->test_done)
              (test,outcome,buffer_for_error_messages,(char *)0x0,buffer_for_extra_output);
    return;
  }
  return;
}

Assistant:

void pcut_report_test_done_unparsed(pcut_item_t *test, int outcome,
		const char *unparsed_output, size_t unparsed_output_size) {

	parse_command_output(unparsed_output, unparsed_output_size,
			buffer_for_extra_output, BUFFER_SIZE,
			buffer_for_error_messages, BUFFER_SIZE);

	pcut_report_test_done(test, outcome, buffer_for_error_messages, NULL, buffer_for_extra_output);
}